

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
* __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::insert_or_upsert<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
          (pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
           *__return_storage_ptr__,
          hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
          *this,transaction_base *transaction,
          pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *value,bool is_upsert)

{
  uint uVar1;
  database *this_00;
  hash_type hash;
  index_pointer node;
  size_t sVar2;
  parent_type *ppVar3;
  bool bVar4;
  uint uVar5;
  address aVar6;
  reference pvVar7;
  pair<pstore::index::details::index_pointer,_bool> pVar8;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> local_1f0;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> local_1e8;
  parent_stack reverse_parents;
  parent_stack parents;
  
  this_00 = transaction->db_;
  uVar1 = *(uint *)(this + 0x10);
  uVar5 = database::get_current_revision(this_00);
  if (uVar1 != uVar5) {
    raise<pstore::error_code>(index_not_latest_revision);
  }
  memset(&parents,0,0xd8);
  bVar4 = hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          ::empty((hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                   *)this);
  if (bVar4) {
    local_1e8.ptr_ = &parents;
    gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
    ensure_invariant(&local_1e8);
    aVar6 = store_leaf_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
                      (this,transaction,value,local_1e8);
    *(value_type *)(this + 0x18) = aVar6.a_;
    *(undefined8 *)(this + 0x20) = 1;
    memcpy(&(__return_storage_ptr__->first).visited_parents_,&parents,0xd8);
    (__return_storage_ptr__->first).db_ = this_00;
    (__return_storage_ptr__->first).index_ =
         (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          *)this;
    (__return_storage_ptr__->first).pos_._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_false>
    ._M_head_impl = (pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *)0x0;
    __return_storage_ptr__->second = true;
  }
  else {
    memset(&reverse_parents,0,0xd8);
    hash = *(hash_type *)((long)&(value->first).v_ + 8);
    node = *(index_pointer *)(this + 0x18);
    local_1f0.ptr_ = &reverse_parents;
    gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
    ensure_invariant(&local_1f0);
    pVar8 = insert_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
                      (this,transaction,node,value,hash,0,local_1f0,is_upsert);
    *(index_pointer *)(this + 0x18) = pVar8.first;
    if (reverse_parents.elements_ != 0) {
      do {
        pvVar7 = array_stack<pstore::index::details::parent_type,_13UL>::top(&reverse_parents);
        if (0xc < parents.elements_) {
          assert_failed("elements_ < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,0x5e);
        }
        sVar2 = pvVar7->position;
        parents.c_._M_elems[parents.elements_].node = pvVar7->node;
        ppVar3 = parents.c_._M_elems + parents.elements_;
        parents.elements_ = parents.elements_ + 1;
        ppVar3->position = sVar2;
        if (reverse_parents.elements_ == 0) {
          assert_failed("elements_ > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,0x6a);
        }
        reverse_parents.elements_ = reverse_parents.elements_ - 1;
      } while (reverse_parents.elements_ != 0);
    }
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
    }
    memcpy(&(__return_storage_ptr__->first).visited_parents_,&parents,0xd8);
    (__return_storage_ptr__->first).db_ = this_00;
    (__return_storage_ptr__->first).index_ =
         (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          *)this;
    (__return_storage_ptr__->first).pos_._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_false>
    ._M_head_impl = (pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *)0x0;
    __return_storage_ptr__->second = (bool)(pVar8.second ^ 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_or_upsert (
            transaction_base & transaction, OtherValueType const & value, bool is_upsert)
            -> std::pair<iterator, bool> {

            database & db = transaction.db ();
            if (revision_ != db.get_current_revision ()) {
                raise (error_code::index_not_latest_revision);
            }

            parent_stack parents;
            if (this->empty ()) {
                root_ = this->store_leaf_node (transaction, value, &parents);
                size_ = 1;
                return std::make_pair (iterator (db, std::move (parents), this), true);
            }

            parent_stack reverse_parents;
            bool key_exists = false;
            auto hash = static_cast<hash_type> (hash_ (value.first));
            std::tie (root_, key_exists) = this->insert_node (
                transaction, root_, value, hash, 0 /* shifts */, &reverse_parents, is_upsert);
            while (!reverse_parents.empty ()) {
                parents.push (reverse_parents.top ());
                reverse_parents.pop ();
            }
            if (!key_exists) {
                ++size_;
            }
            return std::make_pair (iterator (db, std::move (parents), this), !key_exists);
        }